

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_erkstep.c
# Opt level: O0

int erkStep_SetButcherTable(ARKodeMem ark_mem)

{
  ARKodeButcherTable pAVar1;
  ARKodeMem in_RDI;
  sunindextype Blrw;
  sunindextype Bliw;
  ARKodeERKStepMem step_mem;
  int etable;
  ARKODE_ERKTableID in_stack_000000bc;
  long local_30;
  long local_28;
  void *local_20;
  undefined4 local_14;
  ARKodeMem local_10;
  int local_4;
  
  if (in_RDI->step_mem == (void *)0x0) {
    arkProcessError(in_RDI,-0x15,0x331,"erkStep_SetButcherTable",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_erkstep.c"
                    ,"Time step module memory is NULL.");
    local_4 = -0x15;
  }
  else {
    local_20 = in_RDI->step_mem;
    if (*(long *)((long)local_20 + 0x20) == 0) {
      local_14 = 0xffffffff;
      local_10 = in_RDI;
      switch(*(undefined4 *)((long)local_20 + 0x10)) {
      case 1:
        local_14 = 0x16;
        break;
      case 2:
        local_14 = 0;
        break;
      case 3:
        local_14 = 1;
        break;
      case 4:
        local_14 = 3;
        break;
      case 5:
        local_14 = 6;
        break;
      case 6:
        local_14 = 10;
        break;
      case 7:
        local_14 = 0x13;
        break;
      case 8:
        local_14 = 0xb;
        break;
      case 9:
        local_14 = 0x15;
        break;
      default:
        arkProcessError(in_RDI,-0x16,0x34a,"erkStep_SetButcherTable",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_erkstep.c"
                        ,"No explicit method at requested order, using q=9.");
        local_14 = 0x15;
      }
      pAVar1 = ARKodeButcherTable_LoadERK(in_stack_000000bc);
      *(ARKodeButcherTable *)((long)local_20 + 0x20) = pAVar1;
      ARKodeButcherTable_Space(*(ARKodeButcherTable *)((long)local_20 + 0x20),&local_28,&local_30);
      local_10->liw = local_28 + local_10->liw;
      local_10->lrw = local_30 + local_10->lrw;
      if (*(long *)((long)local_20 + 0x20) != 0) {
        *(undefined4 *)((long)local_20 + 0x18) =
             *(undefined4 *)(*(long *)((long)local_20 + 0x20) + 8);
        *(undefined4 *)((long)local_20 + 0x10) = **(undefined4 **)((long)local_20 + 0x20);
        *(undefined4 *)((long)local_20 + 0x14) =
             *(undefined4 *)(*(long *)((long)local_20 + 0x20) + 4);
      }
      local_4 = 0;
    }
    else {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int erkStep_SetButcherTable(ARKodeMem ark_mem)
{
  int etable;
  ARKodeERKStepMem step_mem;
  sunindextype Bliw, Blrw;

  /* access ARKodeERKStepMem structure */
  if (ark_mem->step_mem == NULL)
  {
    arkProcessError(ark_mem, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ERKSTEP_NO_MEM);
    return (ARK_MEM_NULL);
  }
  step_mem = (ARKodeERKStepMem)ark_mem->step_mem;

  /* if table has already been specified, just return */
  if (step_mem->B != NULL) { return (ARK_SUCCESS); }

  /* initialize table number to illegal values */
  etable = -1;

  /* select method based on order */
  switch (step_mem->q)
  {
  case (1): etable = ERKSTEP_DEFAULT_1; break;
  case (2): etable = ERKSTEP_DEFAULT_2; break;
  case (3): etable = ERKSTEP_DEFAULT_3; break;
  case (4): etable = ERKSTEP_DEFAULT_4; break;
  case (5): etable = ERKSTEP_DEFAULT_5; break;
  case (6): etable = ERKSTEP_DEFAULT_6; break;
  case (7): etable = ERKSTEP_DEFAULT_7; break;
  case (8): etable = ERKSTEP_DEFAULT_8; break;
  case (9): etable = ERKSTEP_DEFAULT_9; break;
  default: /* no available method, set default */
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "No explicit method at requested order, using q=9.");
    etable = ERKSTEP_DEFAULT_9;
    break;
  }

  if (etable > -1) { step_mem->B = ARKodeButcherTable_LoadERK(etable); }

  /* note Butcher table space requirements */
  ARKodeButcherTable_Space(step_mem->B, &Bliw, &Blrw);
  ark_mem->liw += Bliw;
  ark_mem->lrw += Blrw;

  /* set [redundant] stored values for stage numbers and method orders */
  if (step_mem->B != NULL)
  {
    step_mem->stages = step_mem->B->stages;
    step_mem->q      = step_mem->B->q;
    step_mem->p      = step_mem->B->p;
  }

  return (ARK_SUCCESS);
}